

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

size_t tool_mime_stdin_read(char *buffer,size_t size,size_t nitems,void *arg)

{
  long lVar1;
  GlobalConfig *config;
  int iVar2;
  curl_off_t cVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  long sonum;
  
  lVar1 = *(long *)((long)arg + 0x58);
  if (-1 < lVar1) {
    sonum = lVar1 - *(long *)((long)arg + 0x60);
    if (sonum == 0 || lVar1 < *(long *)((long)arg + 0x60)) {
      return 0;
    }
    cVar3 = curlx_uztoso(nitems);
    if (sonum < cVar3) {
      nitems = curlx_sotouz(sonum);
    }
  }
  if (nitems == 0) {
    return 0;
  }
  lVar1 = *(long *)((long)arg + 0x18);
  if (lVar1 == 0) {
    nitems = fread(buffer,1,nitems,_stdin);
    iVar2 = ferror(_stdin);
    if (iVar2 != 0) {
      config = *(GlobalConfig **)((long)arg + 0x68);
      if (config != (GlobalConfig *)0x0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        warnf(config,"stdin: %s\n",pcVar6);
        *(undefined8 *)((long)arg + 0x68) = 0;
        return 0x10000000;
      }
      return 0x10000000;
    }
  }
  else {
    sVar4 = curlx_sotouz(*(curl_off_t *)((long)arg + 0x60));
    memcpy(buffer,(void *)(lVar1 + sVar4),nitems);
  }
  cVar3 = curlx_uztoso(nitems);
  *(long *)((long)arg + 0x60) = *(long *)((long)arg + 0x60) + cVar3;
  return nitems;
}

Assistant:

size_t tool_mime_stdin_read(char *buffer,
                            size_t size, size_t nitems, void *arg)
{
  struct tool_mime *sip = (struct tool_mime *) arg;
  curl_off_t bytesleft;
  (void) size;  /* Always 1: ignored. */

  if(sip->size >= 0) {
    if(sip->curpos >= sip->size)
      return 0;  /* At eof. */
    bytesleft = sip->size - sip->curpos;
    if(curlx_uztoso(nitems) > bytesleft)
      nitems = curlx_sotouz(bytesleft);
  }
  if(nitems) {
    if(sip->data) {
      /* Return data from memory. */
      memcpy(buffer, sip->data + curlx_sotouz(sip->curpos), nitems);
    }
    else {
      /* Read from stdin. */
      nitems = fread(buffer, 1, nitems, stdin);
      if(ferror(stdin)) {
        /* Show error only once. */
        if(sip->config) {
          warnf(sip->config, "stdin: %s\n", strerror(errno));
          sip->config = NULL;
        }
        return CURL_READFUNC_ABORT;
      }
    }
    sip->curpos += curlx_uztoso(nitems);
  }
  return nitems;
}